

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

TagHistoryModePolicy * __thiscall
despot::TagHistoryModePolicy::ComputeMode(TagHistoryModePolicy *this,Belief *belief)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long *in_RDX;
  double dVar5;
  double dVar6;
  
  plVar3 = (long *)(**(code **)(*in_RDX + 0x30))();
  despot::State::State((State *)this);
  plVar4 = (long *)*plVar3;
  if ((long *)plVar3[1] != plVar4) {
    lVar1 = *(long *)(belief + 0x90);
    dVar5 = 0.0;
    do {
      lVar2 = *plVar4;
      dVar6 = *(double *)(lVar2 + 0x18) + *(double *)(lVar1 + (long)*(int *)(lVar2 + 0xc) * 8);
      *(double *)(lVar1 + (long)*(int *)(lVar2 + 0xc) * 8) = dVar6;
      if (dVar5 < dVar6) {
        this->field_0x8 = *(undefined1 *)(lVar2 + 8);
        *(undefined4 *)&this->field_0x14 = *(undefined4 *)(lVar2 + 0x14);
        *(undefined8 *)&this->field_0xc = *(undefined8 *)(lVar2 + 0xc);
        *(double *)&this->field_0x18 = dVar6;
        dVar5 = dVar6;
      }
      plVar4 = plVar4 + 1;
    } while( true );
  }
  return this;
}

Assistant:

State ComputeMode(Belief* belief) const {
		const vector<State*>& particles = static_cast<ParticleBelief*>(belief)->particles();
		double maxWeight = 0;
		State mode;
		for (int i = 0; particles.size(); i++) {
			State* particle = particles[i];
			int id = particle->state_id;
			state_probs_[id] += particle->weight;

			if (state_probs_[id] > maxWeight) {
				maxWeight = state_probs_[id];
				mode = *particle;
				mode.weight = maxWeight;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			state_probs_[particles[i]->state_id] = 0;
		}

		return mode;
	}